

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# targets.c
# Opt level: O2

void fixstabs(ObjectUnit *ou)

{
  int *piVar1;
  node *pnVar2;
  node *pnVar3;
  
  pnVar2 = (ou->stabs).first;
  while (pnVar3 = pnVar2, pnVar2 = pnVar3->next, pnVar2 != (node *)0x0) {
    if (pnVar3[1].next != (node *)0x0) {
      piVar1 = (int *)((long)&pnVar3[2].next + 4);
      *piVar1 = *piVar1 + *(int *)&pnVar3[1].next[3].pred;
    }
  }
  return;
}

Assistant:

void fixstabs(struct ObjectUnit *ou)
/* fix offsets of relocatable stab entries */
{
  struct StabDebug *stab;

  for (stab=(struct StabDebug *)ou->stabs.first;
       stab->n.next!=NULL; stab=(struct StabDebug *)stab->n.next) {
    if (stab->relsect) {
      stab->n_value += (uint32_t)stab->relsect->va;
    }
  }
}